

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindResult *__return_storage_ptr__,
      BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
      *this,BoyerMooreTextState *state,void *p0,size_t size,utf32_t replacementChar)

{
  C *end;
  size_t i;
  size_t binSize;
  size_t binOffset;
  ulong length;
  C *p0_00;
  size_t textLength;
  uint decoderState;
  Dfa local_484;
  char *local_478;
  BoyerMooreTextAccessor accessor;
  utf32_t buffer [256];
  
  decoderState = state->m_decoderState;
  p0_00 = (C *)((long)p0 + (size - 1));
  while( true ) {
    if (p0_00 <= (C *)((long)p0 + -1)) {
      *(undefined4 *)&__return_storage_ptr__->m_charOffset = 0xffffffff;
      *(undefined4 *)((long)&__return_storage_ptr__->m_charOffset + 4) = 0xffffffff;
      *(undefined4 *)&__return_storage_ptr__->m_binOffset = 0xffffffff;
      *(undefined4 *)((long)&__return_storage_ptr__->m_binOffset + 4) = 0xffffffff;
      __return_storage_ptr__->m_binEndOffset = 0xffffffffffffffff;
      return __return_storage_ptr__;
    }
    accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>.
    m_p = (wchar_t *)
          CONCAT44(accessor.
                   super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
                   .m_p._4_4_,replacementChar);
    local_484.super_UtfDfa<axl::enc::Utf8ReverseDfa,_axl::enc::Utf8CcMap>.m_cp = 0;
    local_484.super_UtfDfa<axl::enc::Utf8ReverseDfa,_axl::enc::Utf8CcMap>.m_state =
         *(uint_t *)(enc::Utf8ReverseDfa::m_stateDb + (decoderState >> 0x19 & 0x3c));
    local_484.m_acc = decoderState & 0xffffff;
    accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>.
    m_state = (BoyerMooreTextState *)buffer;
    end = enc::Utf8ReverseDecoder::
          decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::enc::ToCaseFolded,axl::enc::Utf8ReverseDecoder>::EncodingEmitter_s>
                    (&local_484,(EncodingEmitter_s *)&accessor,p0_00,(C *)((long)p0 + -1));
    decoderState = local_484.super_UtfDfa<axl::enc::Utf8ReverseDfa,_axl::enc::Utf8CcMap>.m_state <<
                   0x18 | local_484.m_acc;
    textLength = (long)accessor.
                       super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
                       .m_state - (long)buffer >> 2;
    length = (state->super_BoyerMooreStateBase<wchar_t>).m_tail.m_length + textLength;
    local_478 = p0_00;
    accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>.
    m_state = state;
    accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>.
    m_p = (wchar_t *)buffer;
    i = BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
        ::findImpl<axl::sl::BoyerMooreTextAccessor>
                  (&this->
                    super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                   ,&accessor,0,length);
    if (i + (this->
            super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
            ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count <= length)
    break;
    binSize = (long)local_478 - (long)end;
    binOffset = locateBinOffset(state,i,local_478,end);
    BoyerMooreTextState::advance<true>
              (state,i,buffer,textLength,binOffset,end + 1,binSize,decoderState);
    p0_00 = end;
  }
  createFindResult(__return_storage_ptr__,this,state,i,local_478,end);
  return __return_storage_ptr__;
}

Assistant:

BoyerMooreTextFindResult
	find(
		BoyerMooreTextState* state,
		const void* p0,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		ASSERT(state->getPatternLength() == this->m_pattern.getCount());

		sl::PtrIterator<const char, IsReverse> p(IsReverse ? (char*)p0 + size - 1 : (char*)p0);
		const char* end = p + size;

		enc::DecoderState decoderState = state->getDecoderState();

		while (p < end) {
			utf32_t buffer[Details::DecoderBufferLength];

			typename Convert::Result convertResult = Convert::convert(
				&decoderState,
				buffer,
				buffer + countof(buffer),
				p,
				end,
				replacementChar
			);

			const char* p2 = convertResult.m_src; // just a short alias
			size_t srcLength = -(p - p2); // respect IsReverse
			size_t dstLength = convertResult.m_dst - buffer;
			size_t fullLength = state->getTailLength() + dstLength;
			size_t i;

			BoyerMooreTextAccessor accessor(state, buffer);

			if (IsWholeWord) {
				i = findWholeWordImpl(state, accessor, fullLength);
				if (i + this->m_pattern.getCount() < fullLength) // account for suffix
					return createFindResult(state, i, p, p2);

			} else {
				i = this->findImpl(accessor, 0, fullLength);
				if (i + this->m_pattern.getCount() <= fullLength)
					return createFindResult(state, i, p, p2);
			}

			// locate bin-offset of the prospective start of match
			size_t binOffset = locateBinOffset(state, i, p, p2);

			state->advance<IsReverse>(
				i,
				buffer,
				dstLength,
				binOffset,
				IsReverse ? p2 + 1 : (const char*)p,
				srcLength,
				decoderState
			);

 			ASSERT(state->getBinTailSize() >= state->getTailLength());
			p = p2;
		}

		return BoyerMooreTextFindResult();
	}